

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_utils.cpp
# Opt level: O3

void HydroUtils::EB_ComputeFluxes
               (Box *bx,Array4<double> *fx,Array4<double> *fy,Array4<double> *fz,
               Array4<const_double> *umac,Array4<const_double> *vmac,Array4<const_double> *wmac,
               Array4<const_double> *xed,Array4<const_double> *yed,Array4<const_double> *zed,
               Array4<const_double> *apx,Array4<const_double> *apy,Array4<const_double> *apz,
               Geometry *geom,int ncomp,Array4<const_amrex::EBCellFlag> *flag,
               bool fluxes_are_area_weighted)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  EBCellFlag *pEVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  double *pdVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  double *pdVar26;
  long lVar27;
  int iVar28;
  int iVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  int iVar34;
  long lVar35;
  uint32_t *puVar36;
  long lVar37;
  ulong uVar38;
  double *pdVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  double *pdVar43;
  long lVar44;
  bool bVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  int local_140;
  double *local_118;
  double *local_110;
  
  if (fluxes_are_area_weighted) {
    dVar46 = (geom->super_CoordSys).dx[0];
    dVar49 = (geom->super_CoordSys).dx[1];
    dVar47 = (geom->super_CoordSys).dx[2];
    dVar48 = dVar49 * dVar47;
    dVar47 = dVar47 * dVar46;
    dVar46 = dVar46 * dVar49;
  }
  else {
    dVar48 = 1.0;
    dVar47 = 1.0;
    dVar46 = 1.0;
  }
  local_140 = (bx->smallend).vect[2];
  iVar34 = (bx->bigend).vect[2];
  uVar1 = (bx->btype).itype;
  pEVar13 = flag->p;
  lVar14 = flag->jstride;
  lVar15 = flag->kstride;
  lVar32 = (long)(flag->begin).x;
  lVar41 = (long)(flag->begin).y;
  lVar42 = (long)(flag->begin).z;
  uVar30 = (ulong)(uint)ncomp;
  if (0 < ncomp) {
    lVar16 = fx->jstride;
    lVar17 = umac->jstride;
    lVar18 = apx->jstride;
    iVar2 = (apx->begin).y;
    iVar3 = (apx->begin).x;
    iVar4 = (bx->smallend).vect[1];
    lVar31 = (long)iVar4;
    iVar5 = (bx->smallend).vect[0];
    lVar33 = (long)iVar5;
    iVar6 = (umac->begin).y;
    iVar7 = (umac->begin).x;
    lVar19 = xed->jstride;
    local_110 = fx->p + (((lVar31 - (fx->begin).y) * lVar16 + lVar33) - (long)(fx->begin).x);
    lVar20 = fx->kstride;
    lVar21 = fx->nstride;
    iVar8 = (fx->begin).z;
    pdVar22 = umac->p;
    lVar23 = umac->kstride;
    iVar9 = (umac->begin).z;
    local_118 = xed->p + (((lVar31 - (xed->begin).y) * lVar19 + lVar33) - (long)(xed->begin).x);
    lVar24 = xed->kstride;
    lVar25 = xed->nstride;
    iVar10 = (xed->begin).z;
    pdVar26 = apx->p;
    lVar27 = apx->kstride;
    iVar11 = (apx->begin).z;
    iVar29 = (~uVar1 & 1) + (bx->bigend).vect[0];
    iVar12 = (bx->bigend).vect[1];
    uVar38 = 0;
    do {
      iVar28 = local_140;
      if (local_140 <= iVar34) {
        do {
          if (iVar4 <= iVar12) {
            lVar35 = (long)iVar28;
            pdVar43 = (double *)((lVar35 - iVar8) * lVar20 * 8 + (long)local_110);
            lVar44 = (long)pdVar26 +
                     (lVar35 - iVar11) * lVar27 * 8 +
                     lVar33 * 8 + (lVar31 - iVar2) * lVar18 * 8 + (long)iVar3 * -8;
            lVar37 = (long)pdVar22 +
                     (lVar35 - iVar9) * lVar23 * 8 +
                     lVar33 * 8 + (lVar31 - iVar6) * lVar17 * 8 + (long)iVar7 * -8;
            pdVar39 = (double *)((lVar35 - iVar10) * lVar24 * 8 + (long)local_118);
            puVar36 = (uint32_t *)
                      ((long)&pEVar13[((lVar31 - lVar41) * lVar14 + lVar33) - lVar32].flag +
                      (lVar35 - lVar42) * lVar15 * 4);
            lVar35 = lVar31;
            do {
              if (iVar5 <= iVar29) {
                lVar40 = 0;
                do {
                  dVar49 = 0.0;
                  if ((*(byte *)((long)puVar36 + lVar40 * 4 + 2) & 2) != 0) {
                    dVar49 = pdVar39[lVar40] * *(double *)(lVar37 + lVar40 * 8) *
                             *(double *)(lVar44 + lVar40 * 8) * dVar48;
                  }
                  pdVar43[lVar40] = dVar49;
                  lVar40 = lVar40 + 1;
                } while ((iVar29 - iVar5) + 1 != (int)lVar40);
              }
              lVar35 = lVar35 + 1;
              pdVar43 = pdVar43 + lVar16;
              lVar44 = lVar44 + lVar18 * 8;
              lVar37 = lVar37 + lVar17 * 8;
              pdVar39 = pdVar39 + lVar19;
              puVar36 = puVar36 + lVar14;
            } while (iVar12 + 1 != (int)lVar35);
          }
          bVar45 = iVar28 != iVar34;
          iVar28 = iVar28 + 1;
        } while (bVar45);
      }
      uVar38 = uVar38 + 1;
      local_110 = local_110 + lVar21;
      local_118 = local_118 + lVar25;
    } while (uVar38 != uVar30);
    local_140 = (bx->smallend).vect[2];
    iVar34 = (bx->bigend).vect[2];
  }
  if (0 < ncomp) {
    lVar16 = fy->jstride;
    lVar17 = vmac->jstride;
    lVar18 = apy->jstride;
    iVar2 = (apy->begin).y;
    iVar3 = (apy->begin).x;
    iVar29 = (bx->bigend).vect[1] + (uint)((uVar1 & 2) == 0);
    iVar4 = (bx->smallend).vect[1];
    lVar31 = (long)iVar4;
    iVar5 = (bx->smallend).vect[0];
    lVar33 = (long)iVar5;
    iVar6 = (vmac->begin).y;
    iVar7 = (vmac->begin).x;
    lVar19 = yed->jstride;
    local_110 = fy->p + (((lVar31 - (fy->begin).y) * lVar16 + lVar33) - (long)(fy->begin).x);
    lVar20 = fy->kstride;
    lVar21 = fy->nstride;
    iVar8 = (fy->begin).z;
    pdVar22 = vmac->p;
    lVar23 = vmac->kstride;
    iVar9 = (vmac->begin).z;
    pdVar26 = apy->p;
    local_118 = yed->p + (((lVar31 - (yed->begin).y) * lVar19 + lVar33) - (long)(yed->begin).x);
    lVar24 = yed->kstride;
    lVar25 = yed->nstride;
    iVar10 = (yed->begin).z;
    lVar27 = apy->kstride;
    iVar11 = (apy->begin).z;
    iVar12 = (bx->bigend).vect[0];
    uVar38 = 0;
    do {
      iVar28 = local_140;
      if (local_140 <= iVar34) {
        do {
          if (iVar4 <= iVar29) {
            lVar35 = (long)iVar28;
            pdVar43 = (double *)((lVar35 - iVar8) * lVar20 * 8 + (long)local_110);
            lVar44 = (long)pdVar26 +
                     (lVar35 - iVar11) * lVar27 * 8 +
                     lVar33 * 8 + (lVar31 - iVar2) * lVar18 * 8 + (long)iVar3 * -8;
            lVar37 = (long)pdVar22 +
                     (lVar35 - iVar9) * lVar23 * 8 +
                     lVar33 * 8 + (lVar31 - iVar6) * lVar17 * 8 + (long)iVar7 * -8;
            pdVar39 = (double *)((lVar35 - iVar10) * lVar24 * 8 + (long)local_118);
            puVar36 = (uint32_t *)
                      ((long)&pEVar13[((lVar31 - lVar41) * lVar14 + lVar33) - lVar32].flag +
                      (lVar35 - lVar42) * lVar15 * 4);
            lVar35 = lVar31;
            do {
              if (iVar5 <= iVar12) {
                lVar40 = 0;
                do {
                  dVar49 = 0.0;
                  if ((*(byte *)((long)puVar36 + lVar40 * 4 + 1) & 0x80) != 0) {
                    dVar49 = pdVar39[lVar40] * *(double *)(lVar37 + lVar40 * 8) *
                             *(double *)(lVar44 + lVar40 * 8) * dVar47;
                  }
                  pdVar43[lVar40] = dVar49;
                  lVar40 = lVar40 + 1;
                } while ((iVar12 - iVar5) + 1 != (int)lVar40);
              }
              lVar35 = lVar35 + 1;
              pdVar43 = pdVar43 + lVar16;
              lVar44 = lVar44 + lVar18 * 8;
              lVar37 = lVar37 + lVar17 * 8;
              pdVar39 = pdVar39 + lVar19;
              puVar36 = puVar36 + lVar14;
            } while (iVar29 + 1 != (int)lVar35);
          }
          bVar45 = iVar28 != iVar34;
          iVar28 = iVar28 + 1;
        } while (bVar45);
      }
      uVar38 = uVar38 + 1;
      local_110 = local_110 + lVar21;
      local_118 = local_118 + lVar25;
    } while (uVar38 != uVar30);
    local_140 = (bx->smallend).vect[2];
    iVar34 = (bx->bigend).vect[2];
  }
  iVar34 = iVar34 + (uint)((uVar1 & 4) == 0);
  if (0 < ncomp) {
    lVar16 = fz->jstride;
    lVar17 = apz->jstride;
    iVar2 = (apz->begin).y;
    iVar3 = (apz->begin).x;
    iVar4 = (bx->smallend).vect[1];
    lVar31 = (long)iVar4;
    iVar5 = (bx->smallend).vect[0];
    lVar33 = (long)iVar5;
    iVar6 = (wmac->begin).y;
    lVar18 = wmac->jstride;
    iVar7 = (wmac->begin).x;
    lVar19 = zed->jstride;
    local_110 = fz->p + (((lVar31 - (fz->begin).y) * lVar16 + lVar33) - (long)(fz->begin).x);
    pdVar22 = wmac->p;
    lVar20 = fz->kstride;
    lVar21 = fz->nstride;
    iVar8 = (fz->begin).z;
    local_118 = zed->p + (((lVar31 - (zed->begin).y) * lVar19 + lVar33) - (long)(zed->begin).x);
    lVar23 = wmac->kstride;
    iVar9 = (wmac->begin).z;
    lVar24 = zed->kstride;
    lVar25 = zed->nstride;
    iVar10 = (zed->begin).z;
    pdVar26 = apz->p;
    lVar27 = apz->kstride;
    iVar11 = (apz->begin).z;
    iVar12 = (bx->bigend).vect[0];
    iVar29 = (bx->bigend).vect[1];
    uVar38 = 0;
    do {
      iVar28 = local_140;
      if (local_140 <= iVar34) {
        do {
          if (iVar4 <= iVar29) {
            lVar35 = (long)iVar28;
            pdVar39 = (double *)((lVar35 - iVar8) * lVar20 * 8 + (long)local_110);
            lVar37 = (long)pdVar26 +
                     (lVar35 - iVar11) * lVar27 * 8 +
                     lVar33 * 8 + (lVar31 - iVar2) * lVar17 * 8 + (long)iVar3 * -8;
            lVar44 = (long)pdVar22 +
                     (lVar35 - iVar9) * lVar23 * 8 +
                     lVar33 * 8 + (lVar31 - iVar6) * lVar18 * 8 + (long)iVar7 * -8;
            pdVar43 = (double *)((lVar35 - iVar10) * lVar24 * 8 + (long)local_118);
            puVar36 = (uint32_t *)
                      ((long)&pEVar13[((lVar31 - lVar41) * lVar14 + lVar33) - lVar32].flag +
                      (lVar35 - lVar42) * lVar15 * 4);
            lVar35 = lVar31;
            do {
              if (iVar5 <= iVar12) {
                lVar40 = 0;
                do {
                  dVar49 = 0.0;
                  if ((*(byte *)((long)puVar36 + lVar40 * 4 + 1) & 2) != 0) {
                    dVar49 = pdVar43[lVar40] * *(double *)(lVar44 + lVar40 * 8) *
                             *(double *)(lVar37 + lVar40 * 8) * dVar46;
                  }
                  pdVar39[lVar40] = dVar49;
                  lVar40 = lVar40 + 1;
                } while ((iVar12 - iVar5) + 1 != (int)lVar40);
              }
              lVar35 = lVar35 + 1;
              pdVar39 = pdVar39 + lVar16;
              lVar37 = lVar37 + lVar17 * 8;
              lVar44 = lVar44 + lVar18 * 8;
              pdVar43 = pdVar43 + lVar19;
              puVar36 = puVar36 + lVar14;
            } while (iVar29 + 1 != (int)lVar35);
          }
          bVar45 = iVar28 != iVar34;
          iVar28 = iVar28 + 1;
        } while (bVar45);
      }
      uVar38 = uVar38 + 1;
      local_110 = local_110 + lVar21;
      local_118 = local_118 + lVar25;
    } while (uVar38 != uVar30);
  }
  return;
}

Assistant:

void
HydroUtils::EB_ComputeFluxes ( Box const& bx,
                               AMREX_D_DECL( Array4<Real> const& fx,
                                             Array4<Real> const& fy,
                                             Array4<Real> const& fz),
                               AMREX_D_DECL( Array4<Real const> const& umac,
                                             Array4<Real const> const& vmac,
                                             Array4<Real const> const& wmac),
                               AMREX_D_DECL( Array4<Real const> const& xed,
                                             Array4<Real const> const& yed,
                                             Array4<Real const> const& zed),
                               AMREX_D_DECL( Array4<Real const> const& apx,
                                             Array4<Real const> const& apy,
                                             Array4<Real const> const& apz),
                               Geometry const& geom, const int ncomp,
                               Array4<EBCellFlag const> const& flag,
                               const bool fluxes_are_area_weighted )
{

    const auto dx = geom.CellSizeArray();

    GpuArray<Real,AMREX_SPACEDIM> area;

#if ( AMREX_SPACEDIM == 3 )
    if (fluxes_are_area_weighted)
    {
        area[0] = dx[1]*dx[2];
        area[1] = dx[0]*dx[2];
        area[2] = dx[0]*dx[1];
    } else {
        area[0] = 1.; area[1] = 1.; area[2] = 1.;
    }
#else
    if (fluxes_are_area_weighted)
    {
        area[0] = dx[1];
        area[1] = dx[0];
    } else {
        area[0] = 1.; area[1] = 1.;
    }
#endif

    //
    //  X flux
    //
    const Box& xbx = amrex::surroundingNodes(bx,0);

    amrex::ParallelFor(xbx, ncomp, [fx, umac, xed, area, apx, flag]
    AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        if (flag(i,j,k).isConnected(-1,0,0))
            fx(i,j,k,n) = xed(i,j,k,n) * umac(i,j,k) * apx(i,j,k) * area[0];
        else
            fx(i,j,k,n) = 0.;
    });

    //
    //  y flux
    //
    const Box& ybx = amrex::surroundingNodes(bx,1);

    amrex::ParallelFor(ybx, ncomp, [fy, vmac, yed, area, apy, flag]
    AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        if (flag(i,j,k).isConnected(0,-1,0))
            fy(i,j,k,n) = yed(i,j,k,n) * vmac(i,j,k) * apy(i,j,k) * area[1];
        else
            fy(i,j,k,n) = 0.;
    });

#if (AMREX_SPACEDIM==3)
    //
    //  z flux
    //
    const Box& zbx = amrex::surroundingNodes(bx,2);

    amrex::ParallelFor(zbx, ncomp, [fz, wmac, zed, area, apz, flag]
    AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        if (flag(i,j,k).isConnected(0,0,-1))
            fz(i,j,k,n) = zed(i,j,k,n) * wmac(i,j,k) * apz(i,j,k) * area[2];
        else
            fz(i,j,k,n) = 0.;
    });
#endif

}